

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::addSatSI16(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ushort uVar1;
  uint uVar2;
  int32_t iVar3;
  ushort uVar4;
  
  uVar2 = geti32(this);
  iVar3 = geti32(other);
  uVar1 = (ushort)iVar3 + (ushort)uVar2;
  uVar4 = (short)((uVar2 & 0xffff) >> 0xf) + 0x7fff;
  if (-1 < (short)(((ushort)uVar2 ^ uVar1) & ((ushort)iVar3 ^ uVar1))) {
    uVar4 = uVar1;
  }
  *(int *)&__return_storage_ptr__->field_0 = (int)(short)uVar4;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSatSI16(const Literal& other) const {
  return Literal(add_sat_s<int16_t>(geti32(), other.geti32()));
}